

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

MemberExpr * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::MemberExpr,(anonymous_namespace)::Node*&,char_const(&)[3],(anonymous_namespace)::Node*&>
          (Db *this,Node **args,char (*args_1) [3],Node **args_2)

{
  Node *LHS_;
  MemberExpr *this_00;
  StringView local_38;
  Node **local_28;
  Node **args_local_2;
  char (*args_local_1) [3];
  Node **args_local;
  Db *this_local;
  
  local_28 = args_2;
  args_local_2 = (Node **)args_1;
  args_local_1 = (char (*) [3])args;
  args_local = (Node **)this;
  this_00 = (MemberExpr *)
            anon_unknown.dwarf_24939c::BumpPointerAllocator::allocate
                      ((BumpPointerAllocator *)(this + 0x2f0),0x30);
  LHS_ = *(Node **)args_local_1;
  StringView::StringView(&local_38,(char *)args_local_2);
  anon_unknown.dwarf_24939c::MemberExpr::MemberExpr(this_00,LHS_,local_38,*local_28);
  return this_00;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }